

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsymtab.c
# Opt level: O3

void print_scope(D_Scope *st)

{
  D_SymHash *pDVar1;
  ulong uVar2;
  D_Sym *pDVar3;
  
  do {
    printf("SCOPE %p: ",st);
    printf("  owned: %d, kind: %d, ",(ulong)(*(byte *)st >> 2 & 1),(ulong)(*(byte *)st & 3));
    if (st->ll != (D_Sym *)0x0) {
      puts("  LL");
    }
    if (st->hash == (D_SymHash *)0x0) {
LAB_0012d0cf:
      for (pDVar3 = st->ll; pDVar3 != (D_Sym *)0x0; pDVar3 = pDVar3->next) {
        print_sym(pDVar3);
      }
    }
    else {
      puts("  HASH");
      pDVar1 = st->hash;
      if (pDVar1 == (D_SymHash *)0x0) goto LAB_0012d0cf;
      if ((pDVar1->syms).n != 0) {
        uVar2 = 0;
        do {
          pDVar3 = (pDVar1->syms).v[uVar2];
          if (pDVar3 != (D_Sym *)0x0) {
            print_sym(pDVar3);
            pDVar1 = st->hash;
          }
          uVar2 = uVar2 + 1;
        } while (uVar2 < (pDVar1->syms).n);
      }
    }
    puts("\n");
    if (st->dynamic != (D_Scope *)0x0) {
      print_scope(st->dynamic);
    }
    st = st->search;
    if (st == (D_Scope *)0x0) {
      return;
    }
  } while( true );
}

Assistant:

void print_scope(D_Scope *st) {
  printf("SCOPE %p: ", (void *)st);
  printf("  owned: %d, kind: %d, ", st->owned_by_user, st->kind);
  if (st->ll) printf("  LL\n");
  if (st->hash) printf("  HASH\n");
  if (st->hash) {
    uint i;
    for (i = 0; i < st->hash->syms.n; i++)
      if (st->hash->syms.v[i]) print_sym(st->hash->syms.v[i]);
  } else {
    D_Sym *ll = st->ll;
    while (ll) {
      print_sym(ll);
      ll = ll->next;
    }
  }
  printf("\n\n");
  if (st->dynamic) print_scope(st->dynamic);
  if (st->search) print_scope(st->search);
}